

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCompiler.cpp
# Opt level: O2

bool __thiscall Refal2::CLeftPartCompiler::tryMatchRightVariable(CLeftPartCompiler *this)

{
  CVariables *this_00;
  TVariableIndex variableIndex;
  TVariableType TVar1;
  CNodeType *pCVar2;
  bool bVar3;
  CVariable *pCVar4;
  code *pcVar5;
  
  pCVar2 = (this->hole->super_CHole).super_CUnitList.super_CNodeList<Refal2::CUnit>.last;
  if (((pCVar2->super_CUnit).type & UT_Variable) == 0) {
    __assert_fail("hole->GetLast()->IsVariable()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/FunctionCompiler.cpp"
                  ,0x135,"bool Refal2::CLeftPartCompiler::tryMatchRightVariable()");
  }
  variableIndex = (pCVar2->super_CUnit).field_1.variable;
  this_00 = &(this->super_CFunctionCompilerBase).variables;
  bVar3 = CVariables::IsSet(this_00,variableIndex);
  pCVar4 = CVariables::GetVariable(this_00,variableIndex);
  TVar1 = pCVar4->type;
  if (bVar3) {
    if (TVar1 - VT_W < 2) {
      pcVar5 = COperationsBuilder::AddMatchRightDuplicate_WV;
    }
    else if (TVar1 == VT_E) {
      pcVar5 = COperationsBuilder::AddMatchRightDuplicate_E;
    }
    else {
      if (TVar1 != VT_S) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/FunctionCompiler.cpp"
                      ,0x149,"bool Refal2::CLeftPartCompiler::tryMatchRightVariable()");
      }
      pcVar5 = COperationsBuilder::AddMatchRightDuplicate_S;
    }
    matchDuplicateVariable(this,variableIndex,(TMatchDuplicateFunction)pcVar5);
  }
  else {
    if (TVar1 - VT_V < 2) {
      return false;
    }
    if (TVar1 == VT_W) {
      pcVar5 = COperationsBuilder::AddMatchRight_W;
    }
    else {
      if (TVar1 != VT_S) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/FunctionCompiler.cpp"
                      ,0x15b,"bool Refal2::CLeftPartCompiler::tryMatchRightVariable()");
      }
      pcVar5 = COperationsBuilder::AddMatchRight_S;
    }
    matchVariable(this,variableIndex,(TMatchFunction)pcVar5);
  }
  CNodeList<Refal2::CUnit>::RemoveLast((CNodeList<Refal2::CUnit> *)this->hole);
  return true;
}

Assistant:

bool CLeftPartCompiler::tryMatchRightVariable()
{
	assert( hole->GetLast()->IsVariable() );
	const TVariableIndex variable = hole->GetLast()->Variable();
	if( variables.IsSet( variable ) ) {
		// match duplicate
		switch( variables.GetVariable( variable ).GetType() ) {
			case VT_S:
				matchDuplicateVariable( variable,
					&COperationsBuilder::AddMatchRightDuplicate_S );
				break;
			case VT_W:
			case VT_V:
				matchDuplicateVariable( variable,
					&COperationsBuilder::AddMatchRightDuplicate_WV );
				break;
			case VT_E:
				matchDuplicateVariable( variable,
					&COperationsBuilder::AddMatchRightDuplicate_E );
				break;
			case VT_None:
			default:
				assert( false );
				break;
		}
	} else {
		switch( variables.GetVariable( variable ).GetType() ) {
			case VT_S:
				matchVariable( variable,
					&COperationsBuilder::AddMatchRight_S );
				break;
			case VT_W:
				matchVariable( variable,
					&COperationsBuilder::AddMatchRight_W );
				break;
			case VT_V:
			case VT_E:
				return false;
			case VT_None:
			default:
				assert( false );
				break;
		}
	}
	hole->RemoveLast();
	return true;
}